

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void getsize_pointer(t_getsize *x,t_gpointer *gp)

{
  t_gstub *ptVar1;
  _scalar *p_Var2;
  char *pcVar3;
  t_gpointer *object;
  int iVar4;
  _scalar *p_Var5;
  t_symbol *ptVar6;
  t_template *x_00;
  t_gstub *gs;
  int elemsize;
  _array *array;
  t_word *w;
  t_template *template;
  t_symbol *elemtemplatesym;
  t_symbol *fieldsym;
  t_symbol *templatesym;
  int local_20;
  int type;
  int onset;
  int nitems;
  t_gpointer *gp_local;
  t_getsize *x_local;
  
  elemtemplatesym = x->x_fieldsym;
  ptVar1 = gp->gp_stub;
  _onset = gp;
  gp_local = (t_gpointer *)x;
  iVar4 = gpointer_check(gp,0);
  if (iVar4 == 0) {
    pd_error(gp_local,"getsize: stale or empty pointer");
  }
  else {
    if (*(char *)&(((gp_local[2].gp_un.gp_scalar)->sc_gobj).g_pd)->c_name == '\0') {
      fieldsym = gpointer_gettemplatesym(_onset);
    }
    else {
      p_Var2 = gp_local[2].gp_un.gp_scalar;
      fieldsym = (t_symbol *)p_Var2;
      p_Var5 = (_scalar *)gpointer_gettemplatesym(_onset);
      object = gp_local;
      if (p_Var2 != p_Var5) {
        pcVar3 = fieldsym->s_name;
        ptVar6 = gpointer_gettemplatesym(_onset);
        pd_error(object,"getsize %s: got wrong template (%s)",pcVar3,ptVar6->s_name);
        return;
      }
    }
    x_00 = template_findbyname(fieldsym);
    if (x_00 == (t_template *)0x0) {
      pd_error(gp_local,"getsize: couldn\'t find template %s",fieldsym->s_name);
    }
    else {
      iVar4 = template_find_field(x_00,elemtemplatesym,&local_20,(int *)((long)&templatesym + 4),
                                  (t_symbol **)&template);
      if (iVar4 == 0) {
        pd_error(gp_local,"getsize: couldn\'t find array field %s",elemtemplatesym->s_name);
      }
      else if (templatesym._4_4_ == 3) {
        if (ptVar1->gs_which == 2) {
          array = (_array *)(_onset->gp_un).gp_scalar;
        }
        else {
          array = (_array *)((_onset->gp_un).gp_scalar)->sc_vec;
        }
        outlet_float((_outlet *)gp_local[1].gp_un.gp_scalar,
                     (float)**(int **)((long)&array->a_n + (long)local_20));
      }
      else {
        pd_error(gp_local,"getsize: field %s not of type array",elemtemplatesym->s_name);
      }
    }
  }
  return;
}

Assistant:

static void getsize_pointer(t_getsize *x, t_gpointer *gp)
{
    int nitems, onset, type;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_word *w;
    t_array *array;
    int elemsize;
    t_gstub *gs = gp->gp_stub;
    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "getsize: stale or empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gp))
        {
            pd_error(x, "getsize %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "getsize: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x, "getsize: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x, "getsize: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) w = gp->gp_un.gp_w;
    else w = gp->gp_un.gp_scalar->sc_vec;

    array = *(t_array **)(((char *)w) + onset);
    outlet_float(x->x_obj.ob_outlet, (t_float)(array->a_n));
}